

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int cppcms_capi_session_save(cppcms_capi_session *session)

{
  int iVar1;
  
  iVar1 = -1;
  if (session != (cppcms_capi_session *)0x0) {
    cppcms_capi_session::check_loaded_unsaved(session);
    cppcms::session_interface::save((session->p).ptr_);
    session->saved = true;
    (session->adapter).cookies_ptr._M_node =
         (session->adapter).cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cppcms_capi_session_save(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return -1;
		session->check_loaded_unsaved();
		session->p->save();
		session->saved = true;
		session->adapter.cookies_ptr=session->adapter.cookies.begin();
	}